

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,false>::
emplace<llvm::DWARFDebugNames::Entry_const&>
          (OptionalStorage<llvm::DWARFDebugNames::Entry,false> *this,Entry *args)

{
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::reset
            ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)this);
  DWARFDebugNames::Entry::Entry((Entry *)this,args);
  this[0xb8] = (OptionalStorage<llvm::DWARFDebugNames::Entry,false>)0x1;
  return;
}

Assistant:

void emplace(Args &&... args) {
    reset();
    ::new ((void *)std::addressof(value)) T(std::forward<Args>(args)...);
    hasVal = true;
  }